

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

DetectStreamRez *
METADemuxer::DetectStreamReader
          (DetectStreamRez *__return_storage_ptr__,BufferedReaderManager *readManager,
          string *fileName,bool calcDuration)

{
  _Rb_tree_node_base *__k;
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  undefined8 uVar3;
  _func_int **pp_Var4;
  bool bVar5;
  __type _Var6;
  uint uVar7;
  int iVar8;
  TSDemuxer *this;
  undefined7 extraout_var;
  _Base_ptr p_Var9;
  mapped_type *pmVar10;
  undefined4 extraout_var_00;
  iterator iVar11;
  int64_t iVar12;
  uint8_t *tmpBuffer;
  ssize_t sVar13;
  size_t __nbytes;
  _Base_ptr tmpBuffer_00;
  uint i;
  uint uVar14;
  long lVar15;
  CheckStreamRez *pCVar16;
  ContainerType containerType;
  allocator<char> local_641;
  undefined8 local_640;
  undefined8 local_638;
  undefined4 local_630;
  allocator<char> local_62a;
  allocator<char> local_629;
  allocator<char> local_628;
  allocator<char> local_627;
  allocator<char> local_626;
  allocator<char> local_625;
  allocator<char> local_624;
  allocator<char> local_623;
  allocator<char> local_622;
  allocator<char> local_621;
  allocator<char> local_620;
  allocator<char> local_61f;
  allocator<char> local_61e;
  allocator<char> local_61d;
  allocator<char> local_61c;
  allocator<char> local_61b;
  allocator<char> local_61a;
  allocator<char> local_619;
  allocator<char> local_618;
  allocator<char> local_617;
  allocator<char> local_616;
  allocator<char> local_615;
  ContainerType local_614;
  string fileExt;
  int64_t discardedSize;
  vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> Vstreams;
  vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> streams;
  map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
  acceptedPidMap;
  DemuxedData demuxedData;
  string local_4f8;
  AVChapters chapters;
  PIDSet acceptedPidSet;
  string unquoted;
  string clpiFileName;
  string local_430 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  _Rb_tree_color local_3d0 [2];
  int64_t local_3c8;
  bool local_3bf;
  CLPIParser clpi;
  CheckStreamRez local_2b0;
  CheckStreamRez local_210;
  CheckStreamRez local_170;
  CheckStreamRez local_d0;
  undefined4 extraout_var_01;
  
  chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Vstreams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Vstreams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Vstreams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unquoteStr(&unquoted,fileName);
  extractFileExt((string *)&clpi,&unquoted);
  strToLowerCase(&fileExt,(string *)&clpi);
  std::__cxx11::string::~string((string *)&clpi);
  clpi.m_streamInfo._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &clpi.m_streamInfo._M_t._M_impl.super__Rb_tree_header._M_header;
  clpi.m_streamInfo._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  clpi.m_streamInfo._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  clpi.m_programInfo.super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  clpi.m_programInfo.super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  clpi.m_programInfo.super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clpi.m_programInfoMVC.super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clpi.m_programInfoMVC.super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  clpi.m_programInfoMVC.super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  clpi.m_programInfoMVC.super__Vector_base<CLPIProgramInfo,_std::allocator<CLPIProgramInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._2_6_ = 0;
  clpi.type_indicator[0] = '\0';
  clpi.type_indicator[1] = '\0';
  clpi.type_indicator[2] = '\0';
  clpi.type_indicator[3] = '\0';
  clpi.type_indicator[4] = '\0';
  clpi.version_number[0] = '\0';
  clpi.version_number[1] = '\0';
  clpi.version_number[2] = '\0';
  clpi.version_number[3] = '\0';
  clpi.version_number[4] = '\0';
  clpi.m_streamInfo._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  clpi.m_streamInfoMVC._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &clpi.m_streamInfoMVC._M_t._M_impl.super__Rb_tree_header._M_header;
  clpi.m_streamInfoMVC._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  clpi.m_streamInfoMVC._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  clpi.presentation_start_time = 0;
  clpi.presentation_end_time = 0;
  clpi.m_streamInfoMVC._M_t._M_impl.super__Rb_tree_header._M_node_count._0_7_ = 0;
  clpi._159_4_ = 0;
  clpi._164_5_ = 0;
  clpi.number_of_source_packets._1_3_ = 0;
  clpi.format_identifier[0] = '\0';
  clpi.format_identifier[1] = '\0';
  clpi.format_identifier[2] = '\0';
  clpi.format_identifier[3] = '\0';
  clpi.format_identifier[4] = '\0';
  clpi.m_clpiNum = 0;
  clpi.SPN_extent_start.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  clpi.SPN_extent_start.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  clpi.SPN_extent_start.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clpi.interleaveInfo.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  clpi.interleaveInfo.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  clpi.interleaveInfo.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  clpi.interleaveInfo.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  clpi._241_8_ = 0;
  clpi.m_streamInfo._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       clpi.m_streamInfo._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  clpi.m_streamInfoMVC._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       clpi.m_streamInfoMVC._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = std::operator==(&fileExt,"m2ts");
  if (bVar5) {
LAB_001b61d4:
    this = (TSDemuxer *)operator_new(0x2390);
    TSDemuxer::TSDemuxer(this,readManager,"");
    extractFileDir((string *)&demuxedData,&unquoted);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&acceptedPidMap,"CLIPINF",(allocator<char> *)&discardedSize);
    extractFileName(&local_4f8,&unquoted);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &acceptedPidSet,&local_4f8,".clpi");
    findBluRayFile(&clpiFileName,(string *)&demuxedData,(string *)&acceptedPidMap,
                   (string *)&acceptedPidSet);
    std::__cxx11::string::~string((string *)&acceptedPidSet);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)&acceptedPidMap);
    std::__cxx11::string::~string((string *)&demuxedData);
    if (clpiFileName._M_string_length == 0) {
      local_630 = 0;
    }
    else {
      bVar5 = CLPIParser::parse(&clpi,clpiFileName._M_dataplus._M_p);
      local_630 = (undefined4)CONCAT71(extraout_var,bVar5);
    }
    std::__cxx11::string::~string((string *)&clpiFileName);
    local_614 = ctM2TS;
LAB_001b62f0:
    uVar7 = (*(this->super_AbstractDemuxer)._vptr_AbstractDemuxer[0xc])(this);
    (*(this->super_AbstractDemuxer)._vptr_AbstractDemuxer[2])(this,fileName);
    discardedSize = 0;
    demuxedData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &demuxedData._M_t._M_impl.super__Rb_tree_header._M_header;
    demuxedData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    demuxedData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    demuxedData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var1 = &acceptedPidMap._M_t._M_impl.super__Rb_tree_header;
    acceptedPidMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    acceptedPidMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    acceptedPidMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    acceptedPidMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    acceptedPidMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    demuxedData._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         demuxedData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    (*(this->super_AbstractDemuxer)._vptr_AbstractDemuxer[10])(this,&acceptedPidMap);
    acceptedPidSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &acceptedPidSet._M_t._M_impl.super__Rb_tree_header._M_header;
    acceptedPidSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    acceptedPidSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    acceptedPidSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    acceptedPidSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         acceptedPidSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var9 = acceptedPidMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != p_Var1; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &acceptedPidSet,(int *)(p_Var9 + 1));
    }
    for (p_Var9 = demuxedData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &demuxedData._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var9[1]._M_parent,
                 (ulong)uVar7);
    }
    for (uVar14 = 0; uVar14 < (uint)(0x4000000 / (ulong)uVar7); uVar14 = uVar14 + 1) {
      (*(this->super_AbstractDemuxer)._vptr_AbstractDemuxer[7])
                (this,&demuxedData,&acceptedPidSet,&discardedSize);
    }
    local_638 = 0x254090;
    local_640 = 0x2543a0;
    for (p_Var9 = demuxedData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &demuxedData._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      __k = p_Var9 + 1;
      tmpBuffer_00 = p_Var9[1]._M_parent;
      p_Var2 = p_Var9[1]._M_left;
      uVar3 = *(undefined8 *)(p_Var9 + 2);
      pmVar10 = std::
                map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
                ::operator[](&acceptedPidMap,(key_type_conflict *)__k);
      if (tmpBuffer_00 == p_Var2) {
        tmpBuffer_00 = (_Base_ptr)0x0;
      }
      detectTrackReader((CheckStreamRez *)&clpiFileName,(uint8_t *)tmpBuffer_00,(int)uVar3,local_614
                        ,pmVar10->m_trackType,__k->_M_color);
      if ((local_430[0]._M_string_length != 0) && (*local_430[0]._M_dataplus._M_p != 'S')) {
        iVar8 = (*(this->super_AbstractDemuxer)._vptr_AbstractDemuxer[0xd])
                          (this,(ulong)__k->_M_color);
        local_3c8 = CONCAT44(extraout_var_00,iVar8);
      }
      local_3d0[0] = __k->_M_color;
      std::map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>::
      operator[](&acceptedPidMap,(key_type_conflict *)local_3d0);
      std::__cxx11::string::_M_assign((string *)&local_3f0);
      if ((char)local_630 != '\0') {
        iVar11 = std::
                 _Rb_tree<int,_std::pair<const_int,_CLPIStreamInfo>,_std::_Select1st<std::pair<const_int,_CLPIStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
                 ::find(&clpi.m_streamInfo._M_t,(key_type_conflict *)__k);
        if ((_Rb_tree_header *)iVar11._M_node !=
            &clpi.m_streamInfo._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::string::assign((char *)&local_3f0);
        }
      }
      if (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_ == '\0') {
        iVar8 = __cxa_guard_acquire(&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                                     ::langB_abi_cxx11_);
        if (iVar8 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                     ::langB_abi_cxx11_,"alb",(allocator<char> *)&local_4f8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 1),"arm",&local_641);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 2),"baq",&local_615);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 3),"bur",&local_616);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 4),"cze",&local_617);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 5),"chi",&local_618);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 6),"dut",&local_619);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 7),"ger",&local_61a);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 8),"gre",&local_61b);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 9),"fre",&local_61c);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 10),"geo",&local_61d);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0xb),"ice",&local_61e);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0xc),"jaw",&local_61f);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0xd),"mac",&local_620);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0xe),"mao",&local_621);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0xf),"may",&local_622);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x10),"mol",&local_623);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x11),"per",&local_624);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x12),"rum",&local_625);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x13),"scc",&local_626);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x14),"scr",&local_627);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x15),"slo",&local_628);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x16),"tib",&local_629);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x17),"wel",&local_62a);
          __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
          __cxa_guard_release(&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                               ::langB_abi_cxx11_);
        }
      }
      if (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_ == '\0') {
        iVar8 = __cxa_guard_acquire(&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                                     ::langT_abi_cxx11_);
        if (iVar8 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                     ::langT_abi_cxx11_,"sqi",(allocator<char> *)&local_4f8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 1),"hye",&local_641);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 2),"eus",&local_615);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 3),"mya",&local_616);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 4),"ces",&local_617);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 5),"zho",&local_618);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 6),"nld",&local_619);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 7),"deu",&local_61a);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 8),"ell",&local_61b);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 9),"fra",&local_61c);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 10),"kat",&local_61d);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0xb),"isl",&local_61e);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0xc),"jav",&local_61f);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0xd),"mkd",&local_620);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0xe),"mri",&local_621);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0xf),"fas",&local_622);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x10),"rom",&local_623);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x11),"msa",&local_624);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x12),"ron",&local_625);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x13),"srp",&local_626);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x14),"hrv",&local_627);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x15),"slk",&local_628);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x16),"bod",&local_629);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x17),"cym",&local_62a);
          __cxa_atexit(__cxx_global_array_dtor_163,0,&__dso_handle);
          __cxa_guard_release(&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                               ::langT_abi_cxx11_);
        }
      }
      for (lVar15 = 0; lVar15 != 0x300; lVar15 = lVar15 + 0x20) {
        _Var6 = std::operator==(&local_3f0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                                         ::langB_abi_cxx11_[0]._M_dataplus._M_p + lVar15));
        if (_Var6) {
          std::__cxx11::string::_M_assign((string *)&local_3f0);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"A_",&local_641);
      bVar5 = strStartWith(local_430,&local_4f8);
      if (bVar5) {
        pp_Var4 = (this->super_AbstractDemuxer)._vptr_AbstractDemuxer;
        std::__cxx11::string::~string((string *)&local_4f8);
        if ((pp_Var4 == (_func_int **)&PTR__TSDemuxer_0024c5c0) && (0x19ff < (int)local_3d0[0])) {
          local_3bf = true;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&local_4f8);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"V_",&local_641);
      bVar5 = strStartWith(local_430,&local_4f8);
      std::__cxx11::string::~string((string *)&local_4f8);
      if (bVar5) {
        CheckStreamRez::CheckStreamRez(&local_210,(CheckStreamRez *)&clpiFileName);
        pCVar16 = &local_210;
        addTrack(&Vstreams,pCVar16);
      }
      else {
        CheckStreamRez::CheckStreamRez(&local_2b0,(CheckStreamRez *)&clpiFileName);
        pCVar16 = &local_2b0;
        addTrack(&streams,pCVar16);
      }
      CheckStreamRez::~CheckStreamRez(pCVar16);
      CheckStreamRez::~CheckStreamRez((CheckStreamRez *)&clpiFileName);
    }
    (*(this->super_AbstractDemuxer)._vptr_AbstractDemuxer[0xe])(&clpiFileName,this);
    std::vector<AVChapter,_std::allocator<AVChapter>_>::_M_move_assign(&chapters,&clpiFileName);
    std::vector<AVChapter,_std::allocator<AVChapter>_>::~vector
              ((vector<AVChapter,_std::allocator<AVChapter>_> *)&clpiFileName);
    if (calcDuration) {
      iVar8 = (*(this->super_AbstractDemuxer)._vptr_AbstractDemuxer[0x11])(this);
      iVar12 = CONCAT44(extraout_var_01,iVar8);
    }
    else {
      iVar12 = 0;
    }
    (*(this->super_AbstractDemuxer)._vptr_AbstractDemuxer[1])(this);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&acceptedPidSet._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_TrackInfo>,_std::_Select1st<std::pair<const_int,_TrackInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
    ::~_Rb_tree(&acceptedPidMap._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_MemoryBlock>,_std::_Select1st<std::pair<const_int,_MemoryBlock>_>,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
    ::~_Rb_tree(&demuxedData._M_t);
  }
  else {
    bVar5 = std::operator==(&fileExt,"mts");
    if (bVar5) goto LAB_001b61d4;
    bVar5 = std::operator==(&fileExt,"ssif");
    if (bVar5) goto LAB_001b61d4;
    bVar5 = std::operator==(&fileExt,"ts");
    if (bVar5) {
      this = (TSDemuxer *)operator_new(0x2390);
      TSDemuxer::TSDemuxer(this,readManager,"");
      local_614 = ctTS;
LAB_001b6e1f:
      local_630 = 0;
      goto LAB_001b62f0;
    }
    bVar5 = std::operator==(&fileExt,"vob");
    if (bVar5) {
LAB_001b6e05:
      this = (TSDemuxer *)operator_new(0x7e0);
      ProgramStreamDemuxer::ProgramStreamDemuxer((ProgramStreamDemuxer *)this,readManager);
      local_614 = ctVOB;
      goto LAB_001b6e1f;
    }
    bVar5 = std::operator==(&fileExt,"mpg");
    if (bVar5) goto LAB_001b6e05;
    bVar5 = std::operator==(&fileExt,"evo");
    if (bVar5) {
      this = (TSDemuxer *)operator_new(0x7e0);
      ProgramStreamDemuxer::ProgramStreamDemuxer((ProgramStreamDemuxer *)this,readManager);
      local_614 = ctEVOB;
      goto LAB_001b6e1f;
    }
    bVar5 = std::operator==(&fileExt,"mkv");
    if (bVar5) {
LAB_001b6ea1:
      this = (TSDemuxer *)operator_new(0x8c8);
      MatroskaDemuxer::MatroskaDemuxer((MatroskaDemuxer *)this,readManager);
      local_614 = ctMKV;
      goto LAB_001b6e1f;
    }
    bVar5 = std::operator==(&fileExt,"mka");
    if (bVar5) goto LAB_001b6ea1;
    bVar5 = std::operator==(&fileExt,"mks");
    if (bVar5) goto LAB_001b6ea1;
    bVar5 = std::operator==(&fileExt,"mp4");
    if (bVar5) {
LAB_001b6f14:
      this = (TSDemuxer *)operator_new(0x470);
      MovDemuxer::MovDemuxer((MovDemuxer *)this,readManager);
      local_614 = ctMOV;
      goto LAB_001b6e1f;
    }
    bVar5 = std::operator==(&fileExt,"m4v");
    if (bVar5) goto LAB_001b6f14;
    bVar5 = std::operator==(&fileExt,"m4a");
    if (bVar5) goto LAB_001b6f14;
    bVar5 = std::operator==(&fileExt,"mov");
    if (bVar5) goto LAB_001b6f14;
    File::File((File *)&demuxedData);
    __nbytes = 0;
    iVar8 = File::open((File *)&demuxedData,(fileName->_M_dataplus)._M_p,1);
    if ((char)iVar8 == '\0') {
      (__return_storage_ptr__->streams).
      super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->streams).
      super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->chapters).super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->streams).
      super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->chapters).super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->chapters).super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __return_storage_ptr__->fileDurationNano = 0;
    }
    else {
      tmpBuffer = (uint8_t *)operator_new__(0x4000000);
      sVar13 = File::read((File *)&demuxedData,(int)tmpBuffer,(void *)0x4000000,__nbytes);
      bVar5 = std::operator==(&fileExt,"sup");
      if (bVar5) {
        containerType = ctSUP;
      }
      else {
        bVar5 = std::operator==(&fileExt,"pcm");
        containerType = ctLPCM;
        if (!bVar5) {
          bVar5 = std::operator==(&fileExt,"lpcm");
          if (!bVar5) {
            bVar5 = std::operator==(&fileExt,"wav");
            if (!bVar5) {
              bVar5 = std::operator==(&fileExt,"w64");
              if (!bVar5) {
                bVar5 = std::operator==(&fileExt,"srt");
                containerType = (uint)bVar5 + (uint)bVar5 * 8;
              }
            }
          }
        }
      }
      detectTrackReader((CheckStreamRez *)&clpiFileName,tmpBuffer,(int)sVar13,containerType,0,0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&acceptedPidMap,"V_",(allocator<char> *)&acceptedPidSet);
      bVar5 = strStartWith(local_430,(string *)&acceptedPidMap);
      std::__cxx11::string::~string((string *)&acceptedPidMap);
      if (bVar5) {
        pCVar16 = &local_d0;
        CheckStreamRez::CheckStreamRez(pCVar16,(CheckStreamRez *)&clpiFileName);
        addTrack(&Vstreams,pCVar16);
      }
      else {
        pCVar16 = &local_170;
        CheckStreamRez::CheckStreamRez(pCVar16,(CheckStreamRez *)&clpiFileName);
        addTrack(&streams,pCVar16);
      }
      CheckStreamRez::~CheckStreamRez(pCVar16);
      operator_delete__(tmpBuffer);
      CheckStreamRez::~CheckStreamRez((CheckStreamRez *)&clpiFileName);
    }
    File::~File((File *)&demuxedData);
    if ((char)iVar8 == '\0') goto LAB_001b6d43;
    iVar12 = 0;
  }
  std::vector<CheckStreamRez,std::allocator<CheckStreamRez>>::
  insert<__gnu_cxx::__normal_iterator<CheckStreamRez*,std::vector<CheckStreamRez,std::allocator<CheckStreamRez>>>,void>
            ((vector<CheckStreamRez,std::allocator<CheckStreamRez>> *)&Vstreams,
             (const_iterator)
             Vstreams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<CheckStreamRez_*,_std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>_>
              )streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<CheckStreamRez_*,_std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>_>
              )streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
               super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->streams).
  super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->streams).
  super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->chapters).super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->streams).
  super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->chapters).super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->chapters).super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->fileDurationNano = 0;
  std::vector<AVChapter,_std::allocator<AVChapter>_>::operator=
            (&__return_storage_ptr__->chapters,&chapters);
  __return_storage_ptr__->fileDurationNano = iVar12;
  std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator=
            (&__return_storage_ptr__->streams,&Vstreams);
LAB_001b6d43:
  CLPIParser::~CLPIParser(&clpi);
  std::__cxx11::string::~string((string *)&fileExt);
  std::__cxx11::string::~string((string *)&unquoted);
  std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::~vector(&Vstreams);
  std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::~vector(&streams);
  std::vector<AVChapter,_std::allocator<AVChapter>_>::~vector(&chapters);
  return __return_storage_ptr__;
}

Assistant:

DetectStreamRez METADemuxer::DetectStreamReader(const BufferedReaderManager& readManager, const string& fileName,
                                                bool calcDuration)
{
    AVChapters chapters;
    int64_t fileDuration = 0;
    vector<CheckStreamRez> streams, Vstreams;
    AbstractDemuxer* demuxer = nullptr;
    auto unquoted = unquoteStr(fileName);
    string fileExt = strToLowerCase(extractFileExt(unquoted));
    AbstractStreamReader::ContainerType containerType = AbstractStreamReader::ContainerType::ctNone;
    CLPIParser clpi;
    bool clpiParsed = false;
    if (fileExt == "m2ts" || fileExt == "mts" || fileExt == "ssif")
    {
        demuxer = new TSDemuxer(readManager, "");
        containerType = AbstractStreamReader::ContainerType::ctM2TS;
        string clpiFileName = findBluRayFile(extractFileDir(unquoted), "CLIPINF", extractFileName(unquoted) + ".clpi");
        if (!clpiFileName.empty())
            clpiParsed = clpi.parse(clpiFileName.c_str());
    }
    else if (fileExt == "ts")
    {
        demuxer = new TSDemuxer(readManager, "");
        containerType = AbstractStreamReader::ContainerType::ctTS;
    }
    else if (fileExt == "vob" || fileExt == "mpg")
    {
        demuxer = new ProgramStreamDemuxer(readManager);
        containerType = AbstractStreamReader::ContainerType::ctVOB;
    }
    else if (fileExt == "evo")
    {
        demuxer = new ProgramStreamDemuxer(readManager);
        containerType = AbstractStreamReader::ContainerType::ctEVOB;
    }
    else if (fileExt == "mkv" || fileExt == "mka" || fileExt == "mks")
    {
        demuxer = new MatroskaDemuxer(readManager);
        containerType = AbstractStreamReader::ContainerType::ctMKV;
    }
    else if (fileExt == "mp4" || fileExt == "m4v" || fileExt == "m4a" || fileExt == "mov")
    {
        demuxer = new MovDemuxer(readManager);
        containerType = AbstractStreamReader::ContainerType::ctMOV;
    }

    if (demuxer)
    {
        uint32_t fileBlockSize = demuxer->getFileBlockSize();

        demuxer->openFile(fileName);
        int64_t discardedSize = 0;
        DemuxedData demuxedData;
        map<int32_t, TrackInfo> acceptedPidMap;
        demuxer->getTrackList(acceptedPidMap);
        PIDSet acceptedPidSet;
        for (const auto& itr : acceptedPidMap) acceptedPidSet.insert(itr.first);
        for (auto& itr : demuxedData)
        {
            StreamData& vect = itr.second;
            vect.reserve(fileBlockSize);
        }

        for (unsigned i = 0; i < DETECT_STREAM_BUFFER_SIZE / fileBlockSize; i++)
            demuxer->simpleDemuxBlock(demuxedData, acceptedPidSet, discardedSize);

        for (auto& itr : demuxedData)
        {
            StreamData& vect = itr.second;
            CheckStreamRez trackRez = detectTrackReader(vect.data(), static_cast<int>(vect.size()), containerType,
                                                        acceptedPidMap[itr.first].m_trackType, itr.first);
            if (!trackRez.codecInfo.programName.empty())
            {
                if (trackRez.codecInfo.programName[0] != 'S')
                    trackRez.delay = demuxer->getTrackDelay(itr.first);
            }
            trackRez.trackID = itr.first;
            trackRez.lang = acceptedPidMap[trackRez.trackID].m_lang;
            if (clpiParsed)
            {
                map<int, CLPIStreamInfo>::const_iterator clpiStream = clpi.m_streamInfo.find(itr.first);
                if (clpiStream != clpi.m_streamInfo.end())
                    trackRez.lang = clpiStream->second.language_code;
            }
            // correct ISO 639-2/B codes to ISO 639-2/T
            static const std::string langB[24] = {
                "alb", "arm", "baq", "bur", "cze", "chi", "dut", "ger", "gre", "fre", "geo", "ice",
                "jaw", "mac", "mao", "may", "mol", "per", "rum", "scc", "scr", "slo", "tib", "wel",
            };
            static const std::string langT[24] = {
                "sqi", "hye", "eus", "mya", "ces", "zho", "nld", "deu", "ell", "fra", "kat", "isl",
                "jav", "mkd", "mri", "fas", "rom", "msa", "ron", "srp", "hrv", "slk", "bod", "cym",
            };
            for (int i = 0; i < 24; i++)
                if (trackRez.lang == langB[i])
                    trackRez.lang = langT[i];

            if (strStartWith(trackRez.codecInfo.programName, "A_") && dynamic_cast<TSDemuxer*>(demuxer))
            {
                if (trackRez.trackID >= 0x1A00)
                    trackRez.isSecondary = true;
            }

            if (strStartWith(trackRez.codecInfo.programName, "V_"))
                addTrack(Vstreams, trackRez);
            else
                addTrack(streams, trackRez);
        }
        chapters = demuxer->getChapters();
        if (calcDuration)
            fileDuration = demuxer->getFileDurationNano();
        delete demuxer;
    }
    else
    {
        File file;
        containerType = AbstractStreamReader::ContainerType::ctNone;
        if (!file.open(fileName.c_str(), File::ofRead))
            return {};
        auto tmpBuffer = new uint8_t[DETECT_STREAM_BUFFER_SIZE];
        int len = file.read(tmpBuffer, DETECT_STREAM_BUFFER_SIZE);
        if (fileExt == "sup")
            containerType = AbstractStreamReader::ContainerType::ctSUP;
        else if (fileExt == "pcm" || fileExt == "lpcm" || fileExt == "wav" || fileExt == "w64")
            containerType = AbstractStreamReader::ContainerType::ctLPCM;
        else if (fileExt == "srt")
            containerType = AbstractStreamReader::ContainerType::ctSRT;
        CheckStreamRez trackRez = detectTrackReader(tmpBuffer, len, containerType, 0, 0);

        if (strStartWith(trackRez.codecInfo.programName, "V_"))
            addTrack(Vstreams, trackRez);
        else
            addTrack(streams, trackRez);

        delete[] tmpBuffer;
    }
    Vstreams.insert(Vstreams.end(), streams.begin(), streams.end());

    DetectStreamRez rez;
    rez.chapters = chapters;
    rez.fileDurationNano = fileDuration;
    rez.streams = Vstreams;
    return rez;
}